

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O3

void __thiscall CMU462::PathTracer::key_press(PathTracer *this,int key)

{
  iterator *piVar1;
  _Elt_pointer ppBVar2;
  BVHNode *pBVar3;
  _Elt_pointer ppBVar4;
  ulong uVar5;
  BVHNode **__args;
  
  ppBVar2 = (this->selectionHistory).c.
            super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppBVar4 = ppBVar2;
  if (ppBVar2 ==
      (this->selectionHistory).c.
      super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppBVar4 = (this->selectionHistory).c.
              super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pBVar3 = ppBVar4[-1];
  if (key < 0x5d) {
    if (0x3e < key) {
      if (key == 0x3f) {
LAB_00182fe7:
        if (pBVar3 == this->bvh->root) {
          return;
        }
        std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
        ::pop_back(&(this->selectionHistory).c);
        return;
      }
      if (key != 0x53) {
        if (key != 0x5b) {
          return;
        }
        uVar5 = 1;
        if (1 < this->ns_aa) {
          uVar5 = this->ns_aa >> 1;
        }
        goto LAB_00183064;
      }
LAB_00183030:
      this->show_rays = (bool)(this->show_rays ^ 1);
      return;
    }
    if (key == 0x3c) {
LAB_00183038:
      if (pBVar3->l == (BVHNode *)0x0) {
        return;
      }
      if (ppBVar2 ==
          (this->selectionHistory).c.
          super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        __args = &pBVar3->l;
        goto LAB_0018307a;
      }
      *ppBVar2 = pBVar3->l;
      goto LAB_00183054;
    }
    if (key != 0x3e) {
      return;
    }
  }
  else {
    if (key < 0x106) {
      if (key == 0x5d) {
        uVar5 = this->ns_aa * 2;
LAB_00183064:
        this->ns_aa = uVar5;
        printf("Samples per pixel changed to %lu\n");
        return;
      }
      if (key != 0x73) {
        return;
      }
      goto LAB_00183030;
    }
    if (key != 0x106) {
      if (key != 0x107) {
        if (key != 0x109) {
          return;
        }
        goto LAB_00182fe7;
      }
      goto LAB_00183038;
    }
  }
  if (pBVar3->l == (BVHNode *)0x0) {
    return;
  }
  __args = &pBVar3->r;
  if (ppBVar2 ==
      (this->selectionHistory).c.
      super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
LAB_0018307a:
    std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>::
    _M_push_back_aux<CMU462::StaticScene::BVHNode*const&>
              ((deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>> *
               )&this->selectionHistory,__args);
    return;
  }
  *ppBVar2 = *__args;
LAB_00183054:
  piVar1 = &(this->selectionHistory).c.
            super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish;
  piVar1->_M_cur = piVar1->_M_cur + 1;
  return;
}

Assistant:

void PathTracer::key_press(int key) {

    BVHNode *current = selectionHistory.top();
    switch (key) {
      case ']':
        ns_aa *=2;
        printf("Samples per pixel changed to %lu\n", ns_aa);
        //tm_key = clamp(tm_key + 0.02f, 0.0f, 1.0f);
        break;
      case '[':
        //tm_key = clamp(tm_key - 0.02f, 0.0f, 1.0f);
        ns_aa /=2;
        if (ns_aa < 1) ns_aa = 1;
        printf("Samples per pixel changed to %lu\n", ns_aa);
        break;
      case KEYBOARD_UP: case '?':
        if (current != bvh->get_root()) {
          selectionHistory.pop();
        }
        break;
      case KEYBOARD_LEFT: case '<':
        if (current->l) {
          selectionHistory.push(current->l);
        }
        break;
      case KEYBOARD_RIGHT: case '>':
        if (current->l) {
          selectionHistory.push(current->r);
        }
        break;
      case 's':
      case 'S':
        show_rays = !show_rays;
      default:
        return;
    }
  }